

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<double> *this;
  allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_> *this_00;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_> __l_02;
  initializer_list<double> __l_03;
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  iterator iVar4;
  iterator iVar5;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> *func_00;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> *local_368;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> *kv_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *__range1_1;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> *kv;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *__range1;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  grouped;
  double local_280;
  iterator local_278;
  size_type local_270;
  vector<double,_std::allocator<double>_> local_268;
  int local_24c;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_248;
  allocator<double> local_221;
  double local_220 [2];
  iterator local_210;
  size_type local_208;
  vector<double,_std::allocator<double>_> local_200;
  int local_1e4;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_1e0;
  allocator<double> local_1b9;
  double local_1b8 [2];
  iterator local_1a8;
  size_type local_1a0;
  vector<double,_std::allocator<double>_> local_198;
  int local_17c;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_178;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> *local_158;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> local_150;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> local_130;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> local_110;
  iterator local_f0;
  pointer local_e8;
  undefined1 local_e0 [8];
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  expectedGroupBy;
  undefined1 local_a0 [8];
  function<int_(double)> func;
  allocator<double> local_69;
  double local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> test;
  
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_68[4] = 3.0;
  local_68[2] = 2.0;
  local_68[3] = 2.3;
  local_68[0] = 1.0;
  local_68[1] = 1.2;
  local_38 = local_68;
  local_30 = 5;
  std::allocator<double>::allocator(&local_69);
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_03,&local_69);
  std::allocator<double>::~allocator(&local_69);
  std::function<int(double)>::function<main::__0,void>
            ((function<int(double)> *)local_a0,
             (anon_class_1_0_00000001 *)((long)&expectedGroupBy._M_h._M_single_bucket + 7));
  poVar2 = std::operator<<((ostream *)&std::cout,"Test groupBy...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  grouped._M_h._M_single_bucket._6_1_ = 1;
  local_158 = &local_150;
  local_17c = 1;
  local_1b8[0] = 1.0;
  local_1b8[1] = 1.2;
  local_1a8 = local_1b8;
  local_1a0 = 2;
  std::allocator<double>::allocator(&local_1b9);
  __l_01._M_len = local_1a0;
  __l_01._M_array = local_1a8;
  std::vector<double,_std::allocator<double>_>::vector(&local_198,__l_01,&local_1b9);
  std::make_pair<int,std::vector<double,std::allocator<double>>>(&local_178,&local_17c,&local_198);
  std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>::
  pair<int,_std::vector<double,_std::allocator<double>_>,_true>(&local_150,&local_178);
  local_1e4 = 2;
  local_220[0] = 2.0;
  local_220[1] = 2.3;
  local_210 = local_220;
  local_208 = 2;
  local_158 = &local_130;
  std::allocator<double>::allocator(&local_221);
  __l_00._M_len = local_208;
  __l_00._M_array = local_210;
  std::vector<double,_std::allocator<double>_>::vector(&local_200,__l_00,&local_221);
  std::make_pair<int,std::vector<double,std::allocator<double>>>(&local_1e0,&local_1e4,&local_200);
  std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>::
  pair<int,_std::vector<double,_std::allocator<double>_>,_true>(&local_130,&local_1e0);
  local_24c = 3;
  local_280 = 3.0;
  local_278 = &local_280;
  local_270 = 1;
  this = (allocator<double> *)((long)&grouped._M_h._M_single_bucket + 7);
  local_158 = &local_110;
  std::allocator<double>::allocator(this);
  __l._M_len = local_270;
  __l._M_array = local_278;
  std::vector<double,_std::allocator<double>_>::vector(&local_268,__l,this);
  std::make_pair<int,std::vector<double,std::allocator<double>>>(&local_248,&local_24c,&local_268);
  std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>::
  pair<int,_std::vector<double,_std::allocator<double>_>,_true>(&local_110,&local_248);
  grouped._M_h._M_single_bucket._6_1_ = 0;
  local_f0 = &local_150;
  local_e8 = (pointer)0x3;
  this_00 = (allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_> *)
            ((long)&grouped._M_h._M_single_bucket + 3);
  std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>::allocator
            (this_00);
  __l_02._M_len = (size_type)local_e8;
  __l_02._M_array = local_f0;
  std::
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::unordered_map((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                   *)local_e0,__l_02,0,(hasher *)((long)&grouped._M_h._M_single_bucket + 5),
                  (key_equal *)((long)&grouped._M_h._M_single_bucket + 4),this_00);
  std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>::~allocator
            ((allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_> *)
             ((long)&grouped._M_h._M_single_bucket + 3));
  func_00 = &local_150;
  local_368 = (pair<const_int,_std::vector<double,_std::allocator<double>_>_> *)&local_f0;
  do {
    local_368 = local_368 + -1;
    std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>::~pair(local_368);
  } while (local_368 != func_00);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair(&local_248);
  std::vector<double,_std::allocator<double>_>::~vector(&local_268);
  std::allocator<double>::~allocator
            ((allocator<double> *)((long)&grouped._M_h._M_single_bucket + 7));
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair(&local_1e0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_200);
  std::allocator<double>::~allocator(&local_221);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair(&local_178);
  std::vector<double,_std::allocator<double>_>::~vector(&local_198);
  std::allocator<double>::~allocator(&local_1b9);
  Functional::
  groupBy<std::vector,double,std::allocator<double>,int,std::equal_to<int>,std::hash<int>,std::vector<double,std::allocator<double>>,std::allocator<std::pair<int_const,double>>,std::pair<int_const,double>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>>
            ((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
              *)&__range1,(Functional *)local_28,(vector<double,_std::allocator<double>_> *)local_a0
             ,(function<int_(double)> *)func_00);
  __end1 = std::
           unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::begin((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&__range1);
  kv = (pair<const_int,_std::vector<double,_std::allocator<double>_>_> *)
       std::
       unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
       ::end((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
              *)&__range1);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false>
                         *)&kv);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false,_false>
             ::operator*(&__end1);
    iVar4 = std::vector<double,_std::allocator<double>_>::begin(&ppVar3->second);
    iVar5 = std::vector<double,_std::allocator<double>_>::end(&ppVar3->second);
    std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar4._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar5._M_current);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::begin((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)local_e0);
  kv_1 = (pair<const_int,_std::vector<double,_std::allocator<double>_>_> *)
         std::
         unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
         ::end((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                *)local_e0);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false>
                         *)&kv_1);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false,_false>
             ::operator*(&__end1_1);
    iVar4 = std::vector<double,_std::allocator<double>_>::begin(&ppVar3->second);
    iVar5 = std::vector<double,_std::allocator<double>_>::end(&ppVar3->second);
    std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar4._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar5._M_current);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_false,_false>
    ::operator++(&__end1_1);
  }
  bVar1 = std::operator==((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                           *)local_e0,
                          (unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                           *)&__range1);
  if (!bVar1) {
    __assert_fail("expectedGroupBy==grouped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp"
                  ,0x1e,"int main()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&__range1);
  std::
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)local_e0);
  std::function<int_(double)>::~function((function<int_(double)> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main(){
     
  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< int(double) > func= [] (const double & element){return (int)element;};
  
  cout << "Test groupBy..." << endl;
  unordered_map<int, vector<double> > expectedGroupBy={
      make_pair(1, vector<double>{1.0, 1.2}),      
      make_pair(2, vector<double>{2.0, 2.3}),      
      make_pair(3, vector<double>{3.0})      
  };
  auto grouped = Functional::groupBy(test, func);  
  
  for( auto & kv : grouped ){
      sort(kv.second.begin(), kv.second.end());
  }  
  for( auto & kv : expectedGroupBy ){
      sort(kv.second.begin(), kv.second.end());
  }
  
  assert(expectedGroupBy==grouped);
  cout << "passed!" << endl;
  
  return 0;

}